

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall
DLevelScript::DLevelScript
          (DLevelScript *this,AActor *who,line_t_conflict *where,int num,ScriptPtr *code,
          FBehavior *module,int *args,int argcount,int flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  DACSThinker *pDVar5;
  DLevelScript **ppDVar6;
  char *pcVar7;
  size_t len;
  FString local_50;
  int local_48;
  int i;
  FBehavior *local_38;
  FBehavior *module_local;
  ScriptPtr *code_local;
  line_t_conflict *plStack_20;
  int num_local;
  line_t_conflict *where_local;
  AActor *who_local;
  DLevelScript *this_local;
  
  local_38 = module;
  module_local = (FBehavior *)code;
  code_local._4_4_ = num;
  plStack_20 = where;
  where_local = (line_t_conflict *)who;
  who_local = (AActor *)this;
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009f5968;
  TArray<int,_int>::TArray(&this->Localvars);
  TObjPtr<AActor>::TObjPtr(&this->activator);
  this->activeBehavior = local_38;
  len = 0;
  bVar1 = TObjPtr<DACSThinker>::operator==(&DACSThinker::ActiveThinker,(DACSThinker *)0x0);
  if (bVar1) {
    pDVar5 = (DACSThinker *)DObject::operator_new((DObject *)0x60,len);
    DACSThinker::DACSThinker(pDVar5);
  }
  this->script = code_local._4_4_;
  if (*(ushort *)((long)module_local->MapVars + 10) <
      (ushort)*(byte *)((long)module_local->MapVars + 9)) {
    __assert_fail("code->VarCount >= code->ArgCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                  ,0x25c7,
                  "DLevelScript::DLevelScript(AActor *, line_t *, int, const ScriptPtr *, FBehavior *, const int *, int, int)"
                 );
  }
  TArray<int,_int>::Resize(&this->Localvars,(uint)*(ushort *)((long)module_local->MapVars + 10));
  piVar4 = TArray<int,_int>::operator[](&this->Localvars,0);
  memset(piVar4,0,(ulong)*(ushort *)((long)module_local->MapVars + 10) << 2);
  for (local_48 = 0; iVar3 = local_48,
      iVar2 = MIN<int>(argcount,(uint)*(byte *)((long)module_local->MapVars + 9)), iVar3 < iVar2;
      local_48 = local_48 + 1) {
    iVar3 = args[local_48];
    piVar4 = TArray<int,_int>::operator[](&this->Localvars,(long)local_48);
    *piVar4 = iVar3;
  }
  piVar4 = FBehavior::GetScriptAddress(local_38,(ScriptPtr *)module_local);
  this->pc = piVar4;
  iVar3 = FBehavior::GetScriptIndex(local_38,(ScriptPtr *)module_local);
  this->InModuleScriptNumber = iVar3;
  TObjPtr<AActor>::operator=(&this->activator,(AActor *)where_local);
  this->activationline = plStack_20;
  this->backSide = (flags & 1U) != 0;
  this->activefont = SmallFont;
  this->hudheight = 0;
  this->hudwidth = 0;
  this->WrapWidth = 0;
  this->ClipRectHeight = 0;
  this->ClipRectWidth = 0;
  this->ClipRectTop = 0;
  this->ClipRectLeft = 0;
  this->HandleAspect = true;
  this->state = SCRIPT_Running;
  if ((flags & 2U) == 0) {
    pDVar5 = TObjPtr<DACSThinker>::operator->(&DACSThinker::ActiveThinker);
    ppDVar6 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::operator[]
                        (&pDVar5->RunningScripts,code_local._4_4_);
    *ppDVar6 = this;
  }
  Link(this);
  if ((::level.flags2 & 0x800000) != 0) {
    PutLast(this);
  }
  ScriptPresentation((int)&local_50);
  pcVar7 = FString::GetChars(&local_50);
  DPrintf(4,"%s started.\n",pcVar7);
  FString::~FString(&local_50);
  return;
}

Assistant:

DLevelScript::DLevelScript (AActor *who, line_t *where, int num, const ScriptPtr *code, FBehavior *module,
	const int *args, int argcount, int flags)
	: activeBehavior (module)
{
	if (DACSThinker::ActiveThinker == NULL)
		new DACSThinker;

	script = num;
	assert(code->VarCount >= code->ArgCount);
	Localvars.Resize(code->VarCount);
	memset(&Localvars[0], 0, code->VarCount * sizeof(SDWORD));
	for (int i = 0; i < MIN<int>(argcount, code->ArgCount); ++i)
	{
		Localvars[i] = args[i];
	}
	pc = module->GetScriptAddress(code);
	InModuleScriptNumber = module->GetScriptIndex(code);
	activator = who;
	activationline = where;
	backSide = flags & ACS_BACKSIDE;
	activefont = SmallFont;
	hudwidth = hudheight = 0;
	ClipRectLeft = ClipRectTop = ClipRectWidth = ClipRectHeight = WrapWidth = 0;
	HandleAspect = true;
	state = SCRIPT_Running;

	// Hexen waited one second before executing any open scripts. I didn't realize
	// this when I wrote my ACS implementation. Now that I know, it's still best to
	// run them right away because there are several map properties that can't be
	// set in an editor. If an open script sets them, it looks dumb if a second
	// goes by while they're in their default state.

	if (!(flags & ACS_ALWAYS))
		DACSThinker::ActiveThinker->RunningScripts[num] = this;

	Link();

	if (level.flags2 & LEVEL2_HEXENHACK)
	{
		PutLast();
	}

	DPrintf(DMSG_SPAMMY, "%s started.\n", ScriptPresentation(num).GetChars());
}